

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O0

int evfilt_timer_knote_create(filter *filt,knote *kn)

{
  int iVar1;
  int *piVar2;
  long in_RSI;
  long in_RDI;
  int events;
  int flags;
  int tfd;
  itimerspec ts;
  undefined1 local_64 [20];
  undefined4 local_50;
  undefined4 uStack_4c;
  uint32_t local_44;
  uint local_40;
  int local_3c;
  itimerspec local_38;
  long local_18;
  long local_10;
  int local_4;
  
  *(ushort *)(in_RSI + 10) = *(ushort *)(in_RSI + 10) | 0x20;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_3c = timerfd_create(1,0x80000);
  if (local_3c < 0) {
    piVar2 = __errno_location();
    if (*piVar2 != 0x18) {
      __errno_location();
    }
    local_4 = -1;
  }
  else {
    convert_timedata_to_itimerspec
              (&local_38,*(long *)(local_18 + 0x10),*(uint *)(local_18 + 0xc),
               *(ushort *)(local_18 + 10) & 0x10);
    local_40 = (uint)((*(uint *)(local_18 + 0xc) & 8) != 0);
    iVar1 = timerfd_settime(local_3c,local_40,(itimerspec *)&local_38,(itimerspec *)0x0);
    if (iVar1 < 0) {
      close(local_3c);
      local_4 = -1;
    }
    else {
      local_44 = 0x80000001;
      if ((*(ushort *)(local_18 + 10) & 0x90) != 0) {
        local_44 = 0xc0000001;
      }
      local_64._12_8_ = local_18;
      local_50 = 1;
      *(long *)(local_18 + 0x98) = local_18;
      *(ulong *)(local_18 + 0xa0) = CONCAT44(uStack_4c,1);
      local_64._0_4_ = local_44;
      local_64._4_8_ = local_18 + 0x98;
      iVar1 = epoll_ctl(*(int *)(*(long *)(local_10 + 0x98) + 0x7c0),1,local_3c,
                        (epoll_event *)local_64);
      if (iVar1 < 0) {
        close(local_3c);
        local_4 = -1;
      }
      else {
        *(int *)(local_18 + 0x80) = local_3c;
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

int
evfilt_timer_knote_create(struct filter *filt, struct knote *kn)
{
    struct itimerspec ts;
    int tfd;
    int flags;
    int events;

    kn->kev.flags |= EV_CLEAR;

    tfd = timerfd_create(CLOCK_MONOTONIC, TFD_CLOEXEC);
    if (tfd < 0) {
        if ((errno == EMFILE) || (errno == ENFILE)) {
            dbg_perror("timerfd_create(2) fd_used=%u fd_max=%u", get_fd_used(), get_fd_limit());
        } else {
            dbg_perror("timerfd_create(2)");
        }
        return (-1);
    }
    dbg_printf("timer_fd=%i - created", tfd);

    convert_timedata_to_itimerspec(&ts, kn->kev.data, kn->kev.fflags,
                                   kn->kev.flags & EV_ONESHOT);
    flags = (kn->kev.fflags & NOTE_ABSOLUTE) ? TFD_TIMER_ABSTIME : 0;
    if (timerfd_settime(tfd, flags, &ts, NULL) < 0) {
        dbg_printf("timerfd_settime(2): %s", strerror(errno));
        close(tfd);
        return (-1);
    }

    events = EPOLLIN | EPOLLET;
    if (kn->kev.flags & (EV_ONESHOT | EV_DISPATCH))
        events |= EPOLLONESHOT;

    KN_UDATA(kn);   /* populate this knote's kn_udata field */
    if (epoll_ctl(filter_epoll_fd(filt), EPOLL_CTL_ADD, tfd, EPOLL_EV_KN(events, kn)) < 0) {
        dbg_printf("epoll_ctl(2): %d", errno);
        close(tfd);
        return (-1);
    }

    kn->kn_timerfd = tfd;
    return (0);
}